

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LabText.h
# Opt level: O0

char * tsGetTokenAlphaNumericExt
                 (char *pCurr,char *pEnd,char *ext_,char **resultStringBegin,uint32_t *stringLength)

{
  char test_00;
  bool bVar1;
  undefined8 *in_RCX;
  char *in_RDX;
  char *in_RSI;
  int *in_R8;
  char *ext;
  bool accept;
  char test;
  char *in_stack_ffffffffffffffb8;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  byte bVar2;
  undefined1 in_stack_ffffffffffffffc7;
  char *local_38;
  bool local_2a;
  char *local_8;
  
  local_8 = tsScanForNonWhiteSpace
                      ((char *)CONCAT17(in_stack_ffffffffffffffc7,
                                        CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),in_stack_ffffffffffffffb8);
  *in_RCX = local_8;
  *in_R8 = 0;
  while( true ) {
    if (in_RSI <= local_8) {
      return local_8;
    }
    test_00 = *local_8;
    bVar1 = tsIsWhiteSpace(test_00);
    if (bVar1) break;
    bVar1 = tsIsNumeric(test_00);
    local_2a = true;
    local_38 = in_RDX;
    if (!bVar1) {
      local_2a = tsIsAlpha(test_00);
    }
    while( true ) {
      bVar2 = 0;
      if (*local_38 != '\0') {
        bVar2 = local_2a ^ 0xff;
      }
      if ((bVar2 & 1) == 0) break;
      local_2a = local_2a != false || *local_38 == test_00;
      local_38 = local_38 + 1;
    }
    if (local_2a == false) {
      return local_8;
    }
    local_8 = local_8 + 1;
    *in_R8 = *in_R8 + 1;
  }
  return local_8;
}

Assistant:

char const* tsGetTokenAlphaNumericExt(
    char const* pCurr, char const* pEnd,
    char const* ext_,
    char const** resultStringBegin, uint32_t* stringLength)
{
    Assert(pCurr && pEnd);

    pCurr = tsScanForNonWhiteSpace(pCurr, pEnd);
    *resultStringBegin = pCurr;
    *stringLength = 0;

    while (pCurr < pEnd)
    {
        char test = pCurr[0];

        if (tsIsWhiteSpace(test))
            break;

        _Bool accept = tsIsNumeric(test) || tsIsAlpha(test);
        char const* ext = ext_;
        for ( ; *ext && !accept; ++ext)
            accept |= *ext == test;

        if (!accept)
            break;

        ++pCurr;
        *stringLength += 1;
    }

    return pCurr;
}